

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O2

QByteArray *
qCreatev2Hash(QByteArray *__return_storage_ptr__,QAuthenticatorPrivate *ctx,QNtlmPhase3Block *phase3
             )

{
  qsizetype qVar1;
  Data *pDVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  QByteArrayView message;
  QByteArrayView QVar4;
  QCryptographicHash md4;
  QArrayDataPointer<char> local_110;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char> local_e0;
  QStringBuilder<QByteArray,_QByteArray> local_c8;
  QArrayDataPointer<char> local_98;
  QArrayDataPointer<char> local_78;
  QArrayDataPointer<char> local_58;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((phase3->v2Hash).d.size == 0) {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QCryptographicHash::QCryptographicHash((QCryptographicHash *)&local_40,Md4);
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
    qStringAsUcs2Le((QByteArray *)&local_58,&ctx->password);
    QVar4.m_data = (storage_type *)local_58.size;
    QVar4.m_size = (qsizetype)&local_40;
    QCryptographicHash::addData(QVar4);
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QCryptographicHash::result();
    local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QString::toUpper_helper((QString *)&local_f8);
    qStringAsUcs2Le((QByteArray *)&local_e0,(QString *)&local_f8);
    qStringAsUcs2Le((QByteArray *)&local_110,&phase3->domainStr);
    QStringBuilder<QByteArray,_QByteArray>::QStringBuilder
              (&local_c8,(QByteArray *)&local_e0,(QByteArray *)&local_110);
    QStringBuilder<QByteArray,_QByteArray>::convertTo<QByteArray>((QByteArray *)&local_98,&local_c8)
    ;
    QStringBuilder<QByteArray,_QByteArray>::~QStringBuilder(&local_c8);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_110);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_e0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    message.m_data = local_98.ptr;
    message.m_size = local_98.size;
    qEncodeHmacMd5(&local_c8.a,(QByteArray *)&local_78,message);
    pDVar2 = (phase3->v2Hash).d.d;
    pcVar3 = (phase3->v2Hash).d.ptr;
    (phase3->v2Hash).d.d = local_c8.a.d.d;
    (phase3->v2Hash).d.ptr = local_c8.a.d.ptr;
    qVar1 = (phase3->v2Hash).d.size;
    (phase3->v2Hash).d.size = local_c8.a.d.size;
    local_c8.a.d.d = pDVar2;
    local_c8.a.d.ptr = pcVar3;
    local_c8.a.d.size = qVar1;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_c8);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    QCryptographicHash::~QCryptographicHash((QCryptographicHash *)&local_40);
  }
  QArrayDataPointer<char>::QArrayDataPointer(&__return_storage_ptr__->d,&(phase3->v2Hash).d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray qCreatev2Hash(const QAuthenticatorPrivate *ctx,
                                QNtlmPhase3Block *phase3)
{
    Q_ASSERT(phase3 != nullptr);
    // since v2 Hash is need for both NTLMv2 and LMv2 it is calculated
    // only once and stored and reused
    if (phase3->v2Hash.size() == 0) {
        QCryptographicHash md4(QCryptographicHash::Md4);
        QByteArray passUnicode = qStringAsUcs2Le(ctx->password);
        md4.addData(passUnicode);

        QByteArray hashKey = md4.result();
        Q_ASSERT(hashKey.size() == 16);
        // Assuming the user and domain is always unicode in challenge
        QByteArray message =
                qStringAsUcs2Le(ctx->extractedUser.toUpper()) +
                qStringAsUcs2Le(phase3->domainStr);

        phase3->v2Hash = qEncodeHmacMd5(hashKey, message);
    }
    return phase3->v2Hash;
}